

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_merge_overlap
              (char *tile,int pixlen,int ndim,long *tfpixel,long *tlpixel,char *bnullarray,
              char *image,long *fpixel,long *lpixel,int nullcheck,int *status)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  long local_230;
  long local_228;
  long local_220;
  int local_214;
  int overlap_flags;
  int overlap_bytes;
  int ii;
  long imgpixbyte;
  long tilepixbyte;
  long imgpix;
  long tilepix;
  long t4;
  long t3;
  long t2;
  long tl;
  long tf;
  long ipos;
  long im4;
  long im3;
  long im2;
  long im1;
  long it4;
  long it3;
  long it2;
  long it1;
  long i4;
  long i3;
  long i2;
  long i1;
  long inc [6];
  long tilefpix [6];
  long imglpix [6];
  long imgfpix [6];
  long tiledim [6];
  long imgdim [6];
  char *bnullarray_local;
  long *tlpixel_local;
  long *tfpixel_local;
  int ndim_local;
  int pixlen_local;
  char *tile_local;
  
  if (*status < 1) {
    for (overlap_flags = 0; overlap_flags < 6; overlap_flags = overlap_flags + 1) {
      inc[(long)overlap_flags + -1] = 1;
      tiledim[(long)overlap_flags + 5] = 1;
      imgfpix[(long)overlap_flags + 5] = 1;
      imglpix[(long)overlap_flags + 5] = 0;
      tilefpix[(long)overlap_flags + 5] = 0;
      inc[(long)overlap_flags + 5] = 0;
    }
    for (overlap_flags = 0; overlap_flags < ndim; overlap_flags = overlap_flags + 1) {
      if ((tlpixel[overlap_flags] < fpixel[overlap_flags]) ||
         (lpixel[overlap_flags] < tfpixel[overlap_flags])) {
        return *status;
      }
      lVar1 = inc[(long)overlap_flags + -1];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      tiledim[(long)overlap_flags + 5] = (lpixel[overlap_flags] - fpixel[overlap_flags]) / lVar1 + 1
      ;
      if (tiledim[(long)overlap_flags + 5] < 1) {
        *status = 0x143;
        return 0x143;
      }
      imgfpix[(long)overlap_flags + 5] = (tlpixel[overlap_flags] - tfpixel[overlap_flags]) + 1;
      if (imgfpix[(long)overlap_flags + 5] < 1) {
        *status = 0x143;
        return 0x143;
      }
      if (0 < overlap_flags) {
        imgfpix[(long)overlap_flags + 5] =
             imgfpix[(long)(overlap_flags + -1) + 5] * imgfpix[(long)overlap_flags + 5];
      }
      tl = tfpixel[overlap_flags] + -1;
      t2 = tlpixel[overlap_flags] + -1;
      while( true ) {
        lVar1 = inc[(long)overlap_flags + -1];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if ((tl - (fpixel[overlap_flags] + -1)) % lVar1 == 0) break;
        tl = tl + 1;
        if (t2 < tl) {
          return *status;
        }
      }
      while( true ) {
        lVar1 = inc[(long)overlap_flags + -1];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if ((t2 - (fpixel[overlap_flags] + -1)) % lVar1 == 0) break;
        t2 = t2 + -1;
        if (t2 < tl) {
          return *status;
        }
      }
      lVar1 = inc[(long)overlap_flags + -1];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      if (((tl - fpixel[overlap_flags]) + 1) / lVar1 < 1) {
        local_220 = 0;
      }
      else {
        local_220 = inc[(long)overlap_flags + -1];
        if (local_220 < 1) {
          local_220 = -local_220;
        }
        local_220 = ((tl - fpixel[overlap_flags]) + 1) / local_220;
      }
      imglpix[(long)overlap_flags + 5] = local_220;
      lVar1 = inc[(long)overlap_flags + -1];
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      if (((t2 - fpixel[overlap_flags]) + 1) / lVar1 < tiledim[(long)overlap_flags + 5] + -1) {
        local_228 = inc[(long)overlap_flags + -1];
        if (local_228 < 1) {
          local_228 = -local_228;
        }
        local_228 = ((t2 - fpixel[overlap_flags]) + 1) / local_228;
      }
      else {
        local_228 = tiledim[(long)overlap_flags + 5] + -1;
      }
      tilefpix[(long)overlap_flags + 5] = local_228;
      if (fpixel[overlap_flags] - tfpixel[overlap_flags] < 1) {
        local_230 = 0;
      }
      else {
        local_230 = fpixel[overlap_flags] - tfpixel[overlap_flags];
      }
      inc[(long)overlap_flags + 5] = local_230;
      while( true ) {
        lVar1 = inc[(long)overlap_flags + -1];
        if (lVar1 < 1) {
          lVar1 = -lVar1;
        }
        if (((tfpixel[overlap_flags] + inc[(long)overlap_flags + 5]) - fpixel[overlap_flags]) %
            lVar1 == 0) break;
        inc[(long)overlap_flags + 5] = inc[(long)overlap_flags + 5] + 1;
        if (imgfpix[(long)overlap_flags + 5] <= inc[(long)overlap_flags + 5]) {
          return *status;
        }
      }
      if (0 < overlap_flags) {
        tiledim[(long)overlap_flags + 5] =
             tiledim[(long)(overlap_flags + -1) + 5] * tiledim[(long)overlap_flags + 5];
      }
    }
    if (i1 == 1) {
      local_214 = ((int)tilefpix[5] - (int)imglpix[5]) + 1;
    }
    else {
      local_214 = 1;
    }
    im1 = 0;
    for (it1 = 0; it1 <= imglpix[3] - imgfpix[3]; it1 = it1 + 1) {
      while( true ) {
        bVar5 = false;
        if (4 < ndim) {
          lVar1 = inc[3];
          if (inc[3] < 1) {
            lVar1 = -inc[3];
          }
          bVar5 = (((tfpixel[4] + tilefpix[3]) - fpixel[4]) + im1) % lVar1 != 0;
        }
        if (!bVar5) break;
        im1 = im1 + 1;
      }
      if (inc[3] < 1) {
        ipos = imgdim[3] - (it1 + 1 + imgfpix[3]) * imgdim[2];
      }
      else {
        ipos = (it1 + imgfpix[3]) * imgdim[2];
      }
      lVar1 = (tilefpix[3] + im1) * tiledim[2];
      it4 = 0;
      for (i4 = 0; i4 <= imglpix[2] - imgfpix[2]; i4 = i4 + 1) {
        while( true ) {
          bVar5 = false;
          if (3 < ndim) {
            lVar2 = inc[2];
            if (inc[2] < 1) {
              lVar2 = -inc[2];
            }
            bVar5 = (((tfpixel[3] + tilefpix[2]) - fpixel[3]) + it4) % lVar2 != 0;
          }
          if (!bVar5) break;
          it4 = it4 + 1;
        }
        if (inc[2] < 1) {
          lVar2 = imgdim[2] - (i4 + 1 + imgfpix[2]) * imgdim[1];
        }
        else {
          lVar2 = (i4 + imgfpix[2]) * imgdim[1];
        }
        im4 = lVar2 + ipos;
        lVar2 = (tilefpix[2] + it4) * tiledim[1];
        it3 = 0;
        for (i3 = 0; i3 <= imglpix[1] - imgfpix[1]; i3 = i3 + 1) {
          while( true ) {
            bVar5 = false;
            if (2 < ndim) {
              lVar3 = inc[1];
              if (inc[1] < 1) {
                lVar3 = -inc[1];
              }
              bVar5 = (((tfpixel[2] + tilefpix[1]) - fpixel[2]) + it3) % lVar3 != 0;
            }
            if (!bVar5) break;
            it3 = it3 + 1;
          }
          if (inc[1] < 1) {
            lVar3 = imgdim[1] - (i3 + 1 + imgfpix[1]) * imgdim[0];
          }
          else {
            lVar3 = (i3 + imgfpix[1]) * imgdim[0];
          }
          im3 = lVar3 + im4;
          lVar3 = (tilefpix[1] + it3) * tiledim[0];
          it2 = 0;
          for (i2 = 0; i2 <= imglpix[0] - imgfpix[0]; i2 = i2 + 1) {
            while( true ) {
              bVar5 = false;
              if (1 < ndim) {
                lVar4 = inc[0];
                if (inc[0] < 1) {
                  lVar4 = -inc[0];
                }
                bVar5 = (((tfpixel[1] + tilefpix[0]) - fpixel[1]) + it2) % lVar4 != 0;
              }
              if (!bVar5) break;
              it2 = it2 + 1;
            }
            imgpix = inc[5] + (tilefpix[0] + it2) * imgfpix[5] + lVar3 + lVar2 + lVar1;
            if (inc[0] < 1) {
              lVar4 = imgdim[0] - (i2 + 1 + imgfpix[0]) * tiledim[5];
            }
            else {
              lVar4 = (i2 + imgfpix[0]) * tiledim[5];
            }
            im2 = lVar4 + im3;
            lVar4 = imglpix[5];
            if (i1 < 1) {
              lVar4 = (tiledim[5] + -1) - imglpix[5];
            }
            tilepixbyte = lVar4 + im2;
            for (tf = imglpix[5]; tf <= tilefpix[5]; tf = local_214 + tf) {
              memcpy(tile + imgpix * pixlen,image + tilepixbyte * pixlen,(long)(local_214 * pixlen))
              ;
              lVar4 = i1;
              if (i1 < 1) {
                lVar4 = -i1;
              }
              imgpix = local_214 * lVar4 + imgpix;
              if (i1 < 1) {
                lVar4 = -(long)local_214;
              }
              else {
                lVar4 = (long)local_214;
              }
              tilepixbyte = lVar4 + tilepixbyte;
            }
            it2 = it2 + 1;
          }
          it3 = it3 + 1;
        }
        it4 = it4 + 1;
      }
      im1 = im1 + 1;
    }
    tile_local._4_4_ = *status;
  }
  else {
    tile_local._4_4_ = *status;
  }
  return tile_local._4_4_;
}

Assistant:

int imcomp_merge_overlap (
    char *tile,         /* O - multi dimensional array of tile pixels */
    int pixlen,         /* I - number of bytes in each tile or image pixel */
    int ndim,           /* I - number of dimension in the tile and image */
    long *tfpixel,      /* I - first pixel number in each dim. of the tile */
    long *tlpixel,      /* I - last pixel number in each dim. of the tile */
    char *bnullarray,   /* I - array of null flags; used if nullcheck = 2 */
    char *image,        /* I - multi dimensional output image */
    long *fpixel,       /* I - first pixel number in each dim. of the image */
    long *lpixel,       /* I - last pixel number in each dim. of the image */
    int nullcheck,      /* I - 0, 1: do nothing; 2: set nullarray for nulls */
    int *status)

/* 
  Similar to imcomp_copy_overlap, except it copies the overlapping pixels from
  the 'image' to the 'tile'.
*/
{
    long imgdim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                   /* output image, allowing for inc factor */
    long tiledim[MAX_COMPRESS_DIM]; /* product of preceding dimensions in the */
                                 /* tile, array;  inc factor is not relevant */
    long imgfpix[MAX_COMPRESS_DIM]; /* 1st img pix overlapping tile: 0 base, */
                                    /*  allowing for inc factor */
    long imglpix[MAX_COMPRESS_DIM]; /* last img pix overlapping tile 0 base, */
                                    /*  allowing for inc factor */
    long tilefpix[MAX_COMPRESS_DIM]; /* 1st tile pix overlapping img 0 base, */
                                    /*  allowing for inc factor */
    long inc[MAX_COMPRESS_DIM]; /* local copy of input ininc */
    long i1, i2, i3, i4;   /* offset along each axis of the image */
    long it1, it2, it3, it4;
    long im1, im2, im3, im4;  /* offset to image pixel, allowing for inc */
    long ipos, tf, tl;
    long t2, t3, t4;   /* offset along each axis of the tile */
    long tilepix, imgpix, tilepixbyte, imgpixbyte;
    int ii, overlap_bytes, overlap_flags;

    if (*status > 0)
        return(*status);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        /* set default values for higher dimensions */
        inc[ii] = 1;
        imgdim[ii] = 1;
        tiledim[ii] = 1;
        imgfpix[ii] = 0;
        imglpix[ii] = 0;
        tilefpix[ii] = 0;
    }

    /* ------------------------------------------------------------ */
    /* calc amount of overlap in each dimension; if there is zero   */
    /* overlap in any dimension then just return  */
    /* ------------------------------------------------------------ */
    
    for (ii = 0; ii < ndim; ii++)
    {
        if (tlpixel[ii] < fpixel[ii] || tfpixel[ii] > lpixel[ii])
            return(*status);  /* there are no overlapping pixels */

        /* calc dimensions of the output image section */
        imgdim[ii] = (lpixel[ii] - fpixel[ii]) / labs(inc[ii]) + 1;
        if (imgdim[ii] < 1)
            return(*status = NEG_AXIS);

        /* calc dimensions of the tile */
        tiledim[ii] = tlpixel[ii] - tfpixel[ii] + 1;
        if (tiledim[ii] < 1)
            return(*status = NEG_AXIS);

        if (ii > 0)
           tiledim[ii] *= tiledim[ii - 1];  /* product of dimensions */

        /* first and last pixels in image that overlap with the tile, 0 base */
        tf = tfpixel[ii] - 1;
        tl = tlpixel[ii] - 1;

        /* skip this plane if it falls in the cracks of the subsampled image */
        while ((tf-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tf++;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }

        while ((tl-(fpixel[ii] - 1)) % labs(inc[ii]))
        {
           tl--;
           if (tf > tl)
             return(*status);  /* no overlapping pixels */
        }
        imgfpix[ii] = maxvalue((tf - fpixel[ii] +1) / labs(inc[ii]) , 0);
        imglpix[ii] = minvalue((tl - fpixel[ii] +1) / labs(inc[ii]) ,
                               imgdim[ii] - 1);

        /* first pixel in the tile that overlaps with the image (0 base) */
        tilefpix[ii] = maxvalue(fpixel[ii] - tfpixel[ii], 0);

        while ((tfpixel[ii] + tilefpix[ii] - fpixel[ii]) % labs(inc[ii]))
        {
           (tilefpix[ii])++;
           if (tilefpix[ii] >= tiledim[ii])
              return(*status);  /* no overlapping pixels */
        }
/*
printf("ii tfpixel, tlpixel %d %d %d \n",ii, tfpixel[ii], tlpixel[ii]);
printf("ii, tf, tl, imgfpix,imglpix, tilefpix %d %d %d %d %d %d\n",ii,
 tf,tl,imgfpix[ii], imglpix[ii],tilefpix[ii]);
*/
        if (ii > 0)
           imgdim[ii] *= imgdim[ii - 1];  /* product of dimensions */
    }

    /* ---------------------------------------------------------------- */
    /* calc number of pixels in each row (first dimension) that overlap */
    /* multiply by pixlen to get number of bytes to copy in each loop   */
    /* ---------------------------------------------------------------- */

    if (inc[0] != 1)
       overlap_flags = 1;  /* can only copy 1 pixel at a time */
    else
       overlap_flags = imglpix[0] - imgfpix[0] + 1;  /* can copy whole row */

    overlap_bytes = overlap_flags * pixlen;

    /* support up to 5 dimensions for now */
    for (i4 = 0, it4=0; i4 <= imglpix[4] - imgfpix[4]; i4++, it4++)
    {
     /* increment plane if it falls in the cracks of the subsampled image */
     while (ndim > 4 &&  (tfpixel[4] + tilefpix[4] - fpixel[4] + it4)
                          % labs(inc[4]) != 0)
        it4++;

       /* offset to start of hypercube */
       if (inc[4] > 0)
          im4 = (i4 + imgfpix[4]) * imgdim[3];
       else
          im4 = imgdim[4] - (i4 + 1 + imgfpix[4]) * imgdim[3];

      t4 = (tilefpix[4] + it4) * tiledim[3];
      for (i3 = 0, it3=0; i3 <= imglpix[3] - imgfpix[3]; i3++, it3++)
      {
       /* increment plane if it falls in the cracks of the subsampled image */
       while (ndim > 3 &&  (tfpixel[3] + tilefpix[3] - fpixel[3] + it3)
                            % labs(inc[3]) != 0)
          it3++;

       /* offset to start of cube */
       if (inc[3] > 0)
          im3 = (i3 + imgfpix[3]) * imgdim[2] + im4;
       else
          im3 = imgdim[3] - (i3 + 1 + imgfpix[3]) * imgdim[2] + im4;

       t3 = (tilefpix[3] + it3) * tiledim[2] + t4;

       /* loop through planes of the image */
       for (i2 = 0, it2=0; i2 <= imglpix[2] - imgfpix[2]; i2++, it2++)
       {
          /* incre plane if it falls in the cracks of the subsampled image */
          while (ndim > 2 &&  (tfpixel[2] + tilefpix[2] - fpixel[2] + it2)
                               % labs(inc[2]) != 0)
             it2++;

          /* offset to start of plane */
          if (inc[2] > 0)
             im2 = (i2 + imgfpix[2]) * imgdim[1] + im3;
          else
             im2 = imgdim[2] - (i2 + 1 + imgfpix[2]) * imgdim[1] + im3;

          t2 = (tilefpix[2] + it2) * tiledim[1] + t3;

          /* loop through rows of the image */
          for (i1 = 0, it1=0; i1 <= imglpix[1] - imgfpix[1]; i1++, it1++)
          {
             /* incre row if it falls in the cracks of the subsampled image */
             while (ndim > 1 &&  (tfpixel[1] + tilefpix[1] - fpixel[1] + it1)
                                  % labs(inc[1]) != 0)
                it1++;

             /* calc position of first pixel in tile to be copied */
             tilepix = tilefpix[0] + (tilefpix[1] + it1) * tiledim[0] + t2;

             /* offset to start of row */
             if (inc[1] > 0)
                im1 = (i1 + imgfpix[1]) * imgdim[0] + im2;
             else
                im1 = imgdim[1] - (i1 + 1 + imgfpix[1]) * imgdim[0] + im2;
/*
printf("inc = %d %d %d %d\n",inc[0],inc[1],inc[2],inc[3]);
printf("im1,im2,im3,im4 = %d %d %d %d\n",im1,im2,im3,im4);
*/
             /* offset to byte within the row */
             if (inc[0] > 0)
                imgpix = imgfpix[0] + im1;
             else
                imgpix = imgdim[0] - 1 - imgfpix[0] + im1;
/*
printf("tilefpix0,1, imgfpix1, it1, inc1, t2= %d %d %d %d %d %d\n",
       tilefpix[0],tilefpix[1],imgfpix[1],it1,inc[1], t2);
printf("i1, it1, tilepix, imgpix %d %d %d %d \n", i1, it1, tilepix, imgpix);
*/
             /* loop over pixels along one row of the image */
             for (ipos = imgfpix[0]; ipos <= imglpix[0]; ipos += overlap_flags)
             {
               /* convert from image pixel to byte offset */
               tilepixbyte = tilepix * pixlen;
               imgpixbyte  = imgpix  * pixlen;
/*
printf("  tilepix, tilepixbyte, imgpix, imgpixbyte= %d %d %d %d\n",
          tilepix, tilepixbyte, imgpix, imgpixbyte);
*/
               /* copy overlapping row of pixels from image to tile */
               memcpy(tile + tilepixbyte, image + imgpixbyte,  overlap_bytes);

               tilepix += (overlap_flags * labs(inc[0]));
               if (inc[0] > 0)
                 imgpix += overlap_flags;
               else
                 imgpix -= overlap_flags;
            }
          }
        }
      }
    }
    return(*status);
}